

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::multiaggregation(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp,bool *again)

{
  SPxOut *pSVar1;
  uint uVar2;
  undefined4 uVar3;
  MultiAggregationPS *pMVar4;
  type_conflict5 tVar5;
  bool bVar6;
  int iVar7;
  Verbosity VVar8;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  ulong *puVar10;
  char *pcVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  int *piVar14;
  int __c;
  int __c_00;
  int extraout_EDX;
  int __c_01;
  int __c_02;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  int __c_09;
  int __c_10;
  int __c_11;
  int __c_12;
  int __c_13;
  int __c_14;
  undefined1 *in_RDX;
  MultiAggregationPS *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity;
  int l_1;
  int l;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  updateLhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  updateRhs;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  updateRow;
  int rowNumber_1;
  int k_2;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aggAij;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aggConstant;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *bestRow;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minVal_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRes;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minRes;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  bool aggRhs;
  bool aggLhs;
  bool rhsExists;
  bool lhsExists;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  int rowNumber;
  int k_1;
  bool bestislhs;
  int bestpos;
  int maxOtherLocks;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upper;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lower;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int j;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  int oldCols;
  int oldRows;
  int remNzos;
  int remCols;
  int remRows;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_14;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_15;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  MultiAggregationPS *in_stack_ffffffffffffe298;
  MultiAggregationPS *pMVar15;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe2a0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  undefined4 in_stack_ffffffffffffe2a8;
  int in_stack_ffffffffffffe2ac;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe2b0;
  undefined1 *puVar17;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe2b8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe2c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe2d0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe2e0;
  MultiAggregationPS *in_stack_ffffffffffffe310;
  undefined4 in_stack_ffffffffffffe318;
  undefined4 in_stack_ffffffffffffe31c;
  MultiAggregationPS *in_stack_ffffffffffffe320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b68;
  bool local_1b4d;
  bool local_1b4a;
  bool local_1b0d;
  bool local_1b0a;
  type_conflict5 local_1acb;
  type_conflict5 local_1ac9;
  type_conflict5 local_1ac4;
  type_conflict5 local_1ac0;
  type_conflict5 local_1abe;
  type_conflict5 local_1ab9;
  type_conflict5 local_1a65;
  undefined5 in_stack_ffffffffffffe5b0;
  undefined1 in_stack_ffffffffffffe5b5;
  undefined1 in_stack_ffffffffffffe5b6;
  undefined1 in_stack_ffffffffffffe5b7;
  MultiAggregationPS *in_stack_ffffffffffffe5b8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe5c0;
  undefined7 in_stack_ffffffffffffe5c8;
  undefined1 in_stack_ffffffffffffe5cf;
  MultiAggregationPS *in_stack_ffffffffffffe5d0;
  type_conflict5 local_1a1a;
  int local_19dc;
  undefined1 local_19d8 [56];
  int local_19a0;
  undefined4 local_199c;
  Verbosity local_1998;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1994;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_195c;
  undefined1 local_1924 [36];
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffe700;
  uint local_18ec;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_18e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_18b0;
  undefined1 local_1878 [48];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe7b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe7c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe7c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe7d0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe7d8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe7e0;
  undefined1 local_1800 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe810;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe818;
  uint in_stack_ffffffffffffe820;
  uint in_stack_ffffffffffffe824;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe828;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe830;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_17c8;
  undefined1 local_1790 [56];
  undefined1 local_1758 [56];
  undefined8 local_1720;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1714;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_16dc;
  undefined1 local_16a4 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_166c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1634;
  undefined1 local_15fc [56];
  uint local_15c4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_15c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1588;
  undefined4 local_1534;
  uint local_1530;
  undefined1 local_1529;
  undefined1 local_1518 [72];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_14d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1498;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1460;
  undefined1 local_1420 [32];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffec00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffec08;
  undefined1 local_13e8 [56];
  undefined1 local_13b0 [112];
  undefined1 local_1340 [56];
  undefined1 local_1308 [56];
  ulong local_12d0;
  undefined1 local_12c8 [56];
  undefined1 local_1290 [56];
  undefined1 local_1258 [56];
  undefined1 local_1220 [56];
  undefined1 local_11e8 [56];
  undefined1 local_11b0 [168];
  undefined1 local_1108 [56];
  undefined1 local_10d0 [56];
  undefined1 local_1098 [112];
  undefined1 local_1028 [56];
  undefined1 local_ff0 [56];
  ulong local_fb8;
  undefined1 local_fac [56];
  undefined1 local_f74 [56];
  undefined1 local_f3c [56];
  undefined1 local_f04 [56];
  undefined1 local_ecc [56];
  undefined1 local_e94 [112];
  uint local_e24;
  undefined1 local_e20 [56];
  uint local_de8;
  undefined1 local_de4 [56];
  undefined4 local_dac;
  undefined8 local_da8;
  undefined8 local_da0;
  int local_d94;
  undefined8 local_d90;
  undefined8 local_d88;
  undefined4 local_d7c;
  undefined8 local_d78;
  undefined8 local_d70;
  undefined4 local_d64;
  undefined8 local_d60;
  undefined8 local_d58;
  undefined1 local_d50 [56];
  ulong local_d18;
  undefined1 local_d10 [112];
  undefined1 local_ca0 [56];
  undefined1 local_c68 [56];
  undefined1 local_c30 [56];
  type_conflict5 local_bf8;
  type_conflict5 local_bf7;
  byte local_bf6;
  byte local_bf5;
  undefined1 local_bf4 [56];
  undefined1 local_bbc [56];
  undefined4 local_b84;
  uint local_b80;
  byte local_b79;
  int local_b78 [2];
  undefined1 local_b70 [56];
  undefined1 local_b38 [56];
  undefined4 local_b00;
  undefined4 local_afc;
  undefined4 local_ac0;
  undefined4 local_a84;
  undefined1 local_a80 [112];
  undefined4 local_a10;
  undefined4 local_9d4;
  ulong local_9d0;
  undefined1 local_9c8 [168];
  undefined1 local_920 [56];
  ulong local_8e8;
  undefined1 local_8dc [56];
  undefined1 local_8a4 [56];
  uint local_86c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_868;
  undefined4 local_860;
  undefined4 local_85c;
  int local_858 [17];
  int local_814;
  int local_810;
  int local_80c;
  int local_808;
  int local_804;
  undefined1 *local_800;
  MultiAggregationPS *local_7f8;
  undefined8 local_7e8;
  ulong *local_7e0;
  undefined1 *local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined1 *local_7c0;
  undefined8 local_7b8;
  ulong *local_7b0;
  undefined1 *local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined1 *local_790;
  undefined8 local_788;
  ulong *local_780;
  undefined1 *local_778;
  undefined8 local_770;
  undefined8 local_768;
  undefined1 *local_760;
  undefined8 local_758;
  ulong *local_750;
  undefined1 *local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined1 *local_730;
  undefined8 local_728;
  ulong *local_720;
  undefined1 *local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined1 *local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined1 *local_6e8;
  undefined8 local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  undefined8 local_6c8;
  uint *local_6c0;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  uint *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  MultiAggregationPS *local_688;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_680;
  MultiAggregationPS *local_678;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_670;
  undefined4 *local_668;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_660;
  undefined4 *local_658;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_650;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_648;
  undefined1 *local_640;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_638;
  undefined1 *local_630;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_628;
  undefined1 *local_620;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d8;
  undefined1 *local_4d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a8;
  undefined1 *local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  undefined1 *local_490;
  undefined4 *local_488;
  undefined4 *local_480;
  uint *local_478;
  uint *local_470;
  undefined1 *local_468;
  undefined8 local_460;
  undefined8 local_458;
  ulong *local_450;
  undefined8 local_448;
  ulong *local_440;
  undefined8 local_438;
  ulong *local_430;
  undefined8 local_428;
  ulong *local_420;
  undefined8 local_418;
  ulong *local_410;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_401;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_400;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_3c1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_381;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_341;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  undefined1 *local_310;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_301;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2c1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_281;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_241;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  undefined1 *local_210;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_201;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1c1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_181;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined1 *local_150;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_141;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_101;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  long local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  int *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  int *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined8 *local_8;
  
  local_804 = 0;
  local_808 = 0;
  local_80c = 0;
  local_800 = in_RDX;
  local_7f8 = in_RSI;
  local_810 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x41efdd);
  local_814 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x41eff1);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x41f005);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2ac);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x41f021);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2ac);
  local_858[0] = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x41f04d);
  do {
    do {
      do {
        local_858[0] = local_858[0] + -1;
        if (local_858[0] < 0) {
          if (0 < local_808 + local_804) {
            (in_RDI->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remRows = local_804 +
                          (in_RDI->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).m_remRows;
            (in_RDI->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remCols = local_808 +
                          (in_RDI->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).m_remCols;
            (in_RDI->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remNzos = local_80c +
                          (in_RDI->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).m_remNzos;
            if (((in_RDI->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout != (SPxOut *)0x0) &&
               (VVar8 = SPxOut::getVerbosity
                                  ((in_RDI->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout), 3 < (int)VVar8)) {
              local_1998 = SPxOut::getVerbosity
                                     ((in_RDI->
                                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).spxout);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              local_199c = 4;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_199c);
              soplex::operator<<((SPxOut *)in_stack_ffffffffffffe2a0,
                                 (char *)in_stack_ffffffffffffe298);
              soplex::operator<<((SPxOut *)in_stack_ffffffffffffe2a0,
                                 (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_ffffffffffffe2a0,
                                 (char *)in_stack_ffffffffffffe298);
              soplex::operator<<((SPxOut *)in_stack_ffffffffffffe2a0,
                                 (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_ffffffffffffe2a0,
                                 (char *)in_stack_ffffffffffffe298);
              soplex::operator<<((SPxOut *)in_stack_ffffffffffffe2a0,
                                 (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_ffffffffffffe2a0,
                                 (char *)in_stack_ffffffffffffe298);
              soplex::operator<<((SPxOut *)in_stack_ffffffffffffe2a0,
                                 (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffe298);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_1998);
            }
            local_19a0 = local_808 + local_804;
            local_70 = &(in_RDI->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).m_minReduction;
            local_19dc = local_814 + local_810;
            puVar17 = local_19d8;
            local_78 = &local_19dc;
            local_68 = puVar17;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_79,local_70);
            local_60 = puVar17;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
            local_50 = local_70;
            local_58 = local_78;
            local_88 = (long)*local_78;
            local_48 = puVar17;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                       (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298,
                       (longlong *)0x422639);
            tVar5 = boost::multiprecision::operator>
                              ((int *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffe2a0);
            if (tVar5) {
              *local_800 = 1;
            }
          }
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x42267c);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x422689);
          return OKAY;
        }
        local_85c = 0;
        local_650 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe2a0,
                                 (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
        local_658 = &local_85c;
        local_488 = local_658;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                   (long_long_type)in_stack_ffffffffffffe298);
        local_860 = 0;
        local_660 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe2a0,
                                 (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
        local_668 = &local_860;
        local_480 = local_668;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                   (long_long_type)in_stack_ffffffffffffe298);
        pSVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::colVector(in_stack_ffffffffffffe2a0,
                             (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
        iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(pSVar9);
      } while (iVar7 < 2);
      local_868 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::colVector(in_stack_ffffffffffffe2a0,
                              (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
      for (local_86c = 0; uVar2 = local_86c,
          iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_868), (int)uVar2 < iVar7; local_86c = local_86c + 1) {
        local_648 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::value(local_868,local_86c);
        local_640 = local_8a4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::index(local_868,(char *)(ulong)local_86c,__c);
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lhs(in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
        puVar10 = (ulong *)infinity();
        local_8e8 = *puVar10 ^ 0x8000000000000000;
        local_7d8 = local_8dc;
        local_7e0 = &local_8e8;
        local_7e8 = 0;
        local_410 = local_7e0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                   (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                   in_stack_ffffffffffffe2a0);
        tVar5 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe298,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x41f314);
        local_1a1a = false;
        iVar7 = __c_00;
        if (tVar5) {
          in_stack_ffffffffffffe5d0 = local_7f8;
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_868,(char *)(ulong)local_86c,__c_00);
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rhs(in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
          local_7c8 = infinity();
          local_7c0 = local_920;
          local_7d0 = 0;
          local_418 = local_7c8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                     (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                     in_stack_ffffffffffffe2a0);
          in_stack_ffffffffffffe5cf =
               boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_ffffffffffffe298,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x41f3e3);
          iVar7 = extraout_EDX;
          local_1a1a = (type_conflict5)in_stack_ffffffffffffe5cf;
        }
        if (local_1a1a == false) {
          in_stack_ffffffffffffe5b8 = local_7f8;
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_868,(char *)(ulong)local_86c,iVar7);
          in_stack_ffffffffffffe5c0 =
               (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
          puVar10 = (ulong *)infinity();
          local_9d0 = *puVar10 ^ 0x8000000000000000;
          local_7a8 = local_9c8;
          local_7b0 = &local_9d0;
          local_7b8 = 0;
          local_420 = local_7b0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                     (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                     in_stack_ffffffffffffe2a0);
          in_stack_ffffffffffffe5b7 =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_ffffffffffffe298,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x41f52a);
          if ((bool)in_stack_ffffffffffffe5b7) {
            local_9d4 = 0;
            in_stack_ffffffffffffe5b6 =
                 boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                            (int *)in_stack_ffffffffffffe2a0);
            if ((bool)in_stack_ffffffffffffe5b6) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffe2a0,
                           (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                           (int)((ulong)in_stack_ffffffffffffe2a0 >> 0x20));
            }
            else {
              local_a10 = 0;
              in_stack_ffffffffffffe5b5 =
                   boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                              (int *)in_stack_ffffffffffffe2a0);
              if ((bool)in_stack_ffffffffffffe5b5) {
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe2a0,
                             (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
                boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                             (int)((ulong)in_stack_ffffffffffffe2a0 >> 0x20));
              }
            }
          }
          else {
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::index(local_868,(char *)(ulong)local_86c,__c_01);
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::rhs(in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
            local_798 = infinity();
            local_790 = local_a80;
            local_7a0 = 0;
            local_428 = local_798;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                       (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                       in_stack_ffffffffffffe2a0);
            tVar5 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffe298,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x41f6b6);
            if (tVar5) {
              local_a84 = 0;
              tVar5 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                                 (int *)in_stack_ffffffffffffe2a0);
              if (tVar5) {
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe2a0,
                             (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
                boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                             (int)((ulong)in_stack_ffffffffffffe2a0 >> 0x20));
              }
              else {
                local_ac0 = 0;
                tVar5 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                                   (int *)in_stack_ffffffffffffe2a0);
                if (tVar5) {
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe2a0,
                               (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
                  boost::multiprecision::
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                               (int)((ulong)in_stack_ffffffffffffe2a0 >> 0x20));
                }
              }
            }
          }
        }
        else {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                       (int)((ulong)in_stack_ffffffffffffe2a0 >> 0x20));
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                       (int)((ulong)in_stack_ffffffffffffe2a0 >> 0x20));
        }
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
      local_afc = 1;
      tVar5 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                         (int *)in_stack_ffffffffffffe2a0);
      local_1a65 = true;
      if (!tVar5) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
        local_b00 = 1;
        local_1a65 = boost::multiprecision::operator==
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                                (int *)in_stack_ffffffffffffe2a0);
      }
    } while (local_1a65 == false);
    local_638 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower(in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
    local_630 = local_b38;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
    local_628 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper(in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
    local_620 = local_b70;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
    local_b78[0] = -1;
    local_b79 = 1;
    for (local_b80 = 0; uVar2 = local_b80,
        iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_868), (int)uVar2 < iVar7; local_b80 = local_b80 + 1) {
      local_698 = local_bbc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
      local_690 = local_bf4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
      local_618 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(local_868,local_b80);
      local_610 = local_c30;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
      pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::index(local_868,(char *)(ulong)local_b80,__c_02);
      local_b84 = SUB84(pcVar11,0);
      local_498 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
      local_490 = local_bbc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
      local_4a8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rhs(in_stack_ffffffffffffe2a0,(int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
      local_4a0 = local_bf4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
      local_600 = local_c68;
      local_608 = local_bbc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
      local_5f0 = local_ca0;
      local_5f8 = local_bf4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
      feastol(in_stack_ffffffffffffe2d8);
      bVar6 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe320,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe31c,in_stack_ffffffffffffe318),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe310);
      if (!bVar6) {
        puVar10 = (ulong *)infinity();
        local_d18 = *puVar10 ^ 0x8000000000000000;
        local_778 = local_d10;
        local_780 = &local_d18;
        local_788 = 0;
        local_430 = local_780;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                   (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                   in_stack_ffffffffffffe2a0);
        local_bf5 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffe298,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x41fbd2);
        local_768 = infinity();
        local_760 = local_d50;
        local_770 = 0;
        local_438 = local_768;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                   (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                   in_stack_ffffffffffffe2a0);
        local_bf6 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffe298,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x41fc5a);
        pSVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::rowVector(in_stack_ffffffffffffe2a0,
                             (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
        iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(pSVar9);
        if (iVar7 < 3) {
          local_b78[1] = 0x7fffffff;
          pMVar15 = in_stack_ffffffffffffe298;
          pSVar16 = in_stack_ffffffffffffe2a0;
        }
        else {
          pSVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::rowVector(in_stack_ffffffffffffe2a0,
                               (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
          iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar9);
          if (iVar7 == 3) {
            local_b78[1] = 3;
            pMVar15 = in_stack_ffffffffffffe298;
            pSVar16 = in_stack_ffffffffffffe2a0;
          }
          else {
            pSVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::rowVector(in_stack_ffffffffffffe2a0,
                                 (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
            iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(pSVar9);
            pMVar15 = in_stack_ffffffffffffe298;
            pSVar16 = in_stack_ffffffffffffe2a0;
            if (iVar7 == 4) {
              local_b78[1] = 2;
            }
            else {
              local_b78[1] = 1;
            }
          }
        }
        local_1ab9 = false;
        if ((local_bf5 & 1) != 0) {
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::value(local_868,local_b80);
          local_d58 = 0;
          tVar5 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pMVar15,(double *)0x41fd83);
          if (tVar5) {
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::maxObj(pSVar16,(int)((ulong)pMVar15 >> 0x20));
            local_d60 = 0;
            tVar5 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pMVar15,(double *)0x41fdcc);
            if (!tVar5) goto LAB_0041fe72;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)pSVar16,(int)((ulong)pMVar15 >> 0x20));
            local_d64 = 1;
            tVar5 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                               (int *)pSVar16);
            if (!tVar5) goto LAB_0041fe72;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)pSVar16,(int)((ulong)pMVar15 >> 0x20));
            tVar5 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                               (int *)pSVar16);
            local_1abe = true;
            if (!tVar5) goto LAB_0041fe72;
          }
          else {
LAB_0041fe72:
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::value(local_868,local_b80);
            local_d70 = 0;
            tVar5 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pMVar15,(double *)0x41fea2);
            local_1ac0 = false;
            if (tVar5) {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::maxObj(pSVar16,(int)((ulong)pMVar15 >> 0x20));
              local_d78._0_4_ = 0;
              local_d78._4_4_ = 0;
              tVar5 = boost::multiprecision::operator>=
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)pMVar15,(double *)0x41fef5);
              local_1ac0 = false;
              if (tVar5) {
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)pSVar16,(int)((ulong)pMVar15 >> 0x20));
                local_d7c._0_1_ = true;
                local_d7c._1_3_ = 0;
                tVar5 = boost::multiprecision::operator==
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                                   (int *)pSVar16);
                local_1ac0 = false;
                if (tVar5) {
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)pSVar16,(int)((ulong)pMVar15 >> 0x20));
                  local_1ac0 = boost::multiprecision::operator<=
                                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT44(in_stack_ffffffffffffe2ac,
                                                      in_stack_ffffffffffffe2a8),(int *)pSVar16);
                }
              }
            }
            local_1abe = local_1ac0;
          }
          local_1ab9 = local_1abe;
        }
        local_bf7 = local_1ab9;
        local_1ac4 = false;
        if ((local_bf6 & 1) != 0) {
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::value(local_868,local_b80);
          local_d88 = 0;
          tVar5 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pMVar15,(double *)0x420017);
          if (tVar5) {
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::maxObj(pSVar16,(int)((ulong)pMVar15 >> 0x20));
            local_d90 = 0;
            tVar5 = boost::multiprecision::operator>=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pMVar15,(double *)0x420060);
            if (!tVar5) goto LAB_00420106;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)pSVar16,(int)((ulong)pMVar15 >> 0x20));
            local_d94 = 1;
            tVar5 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                               (int *)pSVar16);
            if (!tVar5) goto LAB_00420106;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)pSVar16,(int)((ulong)pMVar15 >> 0x20));
            tVar5 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                               (int *)pSVar16);
            local_1ac9 = true;
            if (!tVar5) goto LAB_00420106;
          }
          else {
LAB_00420106:
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::value(local_868,local_b80);
            local_da0 = 0;
            tVar5 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pMVar15,(double *)0x420136);
            local_1acb = false;
            if (tVar5) {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::maxObj(pSVar16,(int)((ulong)pMVar15 >> 0x20));
              local_da8 = 0;
              tVar5 = boost::multiprecision::operator<=
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)pMVar15,(double *)0x420189);
              local_1acb = false;
              if (tVar5) {
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)pSVar16,(int)((ulong)pMVar15 >> 0x20));
                local_dac = 1;
                tVar5 = boost::multiprecision::operator==
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                                   (int *)pSVar16);
                local_1acb = false;
                if (tVar5) {
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)pSVar16,(int)((ulong)pMVar15 >> 0x20));
                  local_1acb = boost::multiprecision::operator<=
                                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT44(in_stack_ffffffffffffe2ac,
                                                      in_stack_ffffffffffffe2a8),(int *)pSVar16);
                }
              }
            }
            local_1ac9 = local_1acb;
          }
          local_1ac4 = local_1ac9;
        }
        local_bf8 = local_1ac4;
        if (((local_bf7 & 1U) != 0) ||
           (in_stack_ffffffffffffe298 = pMVar15, in_stack_ffffffffffffe2a0 = pSVar16,
           local_1ac4 != false)) {
          local_de8 = 0;
          local_6b8 = local_de4;
          local_6c0 = &local_de8;
          local_6c8 = 0;
          local_470 = local_6c0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                     CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),pSVar16);
          local_e24 = 0;
          local_6a0 = local_e20;
          local_6a8 = &local_e24;
          local_6b0 = 0;
          local_478 = local_6a8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                     CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),pSVar16);
          computeMinMaxResidualActivity
                    (in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,in_stack_ffffffffffffe824,
                     in_stack_ffffffffffffe820,in_stack_ffffffffffffe818,in_stack_ffffffffffffe810);
          if ((local_bf7 & 1U) != 0) {
            in_stack_ffffffffffffe298 = (MultiAggregationPS *)(local_e94 + 0x38);
            local_688 = in_stack_ffffffffffffe298;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16);
            in_stack_ffffffffffffe2a0 =
                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_e94;
            local_680 = in_stack_ffffffffffffe2a0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16);
            local_5e0 = local_ecc;
            local_5e8 = local_bbc;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15);
            local_5d0 = local_f04;
            local_5d8 = local_c30;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15);
            local_5c0 = local_f3c;
            local_5c8 = local_de4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15);
            local_5b0 = local_f74;
            local_5b8 = local_e20;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15);
            computeMinMaxValues(in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8,
                                in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,
                                in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8,
                                &in_stack_ffffffffffffec00->val,in_stack_ffffffffffffec08);
            puVar10 = (ulong *)infinity();
            local_fb8 = *puVar10 ^ 0x8000000000000000;
            local_748 = local_fac;
            local_750 = &local_fb8;
            local_758 = 0;
            local_440 = local_750;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                       (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                       in_stack_ffffffffffffe2a0);
            tVar5 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffe298,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x4205bb);
            local_1b0a = false;
            iVar7 = extraout_EDX_00;
            if (tVar5) {
              local_5a0 = local_ff0;
              local_5a8 = local_e94 + 0x38;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
              local_590 = local_1028;
              local_598 = local_b38;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
              feastol(in_stack_ffffffffffffe2d8);
              bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_ffffffffffffe2e0,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffe2d8,in_stack_ffffffffffffe2d0);
              local_1b0a = false;
              iVar7 = extraout_EDX_01;
              if (bVar6) {
                local_738 = infinity();
                local_730 = local_1098;
                local_740 = 0;
                local_448 = local_738;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                           (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                           in_stack_ffffffffffffe2a0);
                tVar5 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffe298,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x42070e);
                local_1b0d = false;
                iVar7 = extraout_EDX_02;
                if (tVar5) {
                  local_580 = local_10d0;
                  local_588 = local_e94;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
                  local_570 = local_1108;
                  local_578 = local_b70;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
                  feastol(in_stack_ffffffffffffe2d8);
                  local_1b0d = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)in_stack_ffffffffffffe320,
                                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT44(in_stack_ffffffffffffe31c,
                                                      in_stack_ffffffffffffe318),
                                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)in_stack_ffffffffffffe310);
                  iVar7 = extraout_EDX_03;
                }
                local_1b0a = local_1b0d;
              }
            }
            pMVar15 = in_stack_ffffffffffffe298;
            pSVar16 = in_stack_ffffffffffffe2a0;
            if (local_1b0a != false) {
              pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::index(local_868,(char *)(ulong)local_b80,iVar7);
              local_b78[0] = (int)pcVar11;
              local_b79 = 1;
              break;
            }
          }
          in_stack_ffffffffffffe298 = pMVar15;
          in_stack_ffffffffffffe2a0 = pSVar16;
          if ((local_bf8 & 1U) != 0) {
            in_stack_ffffffffffffe298 = (MultiAggregationPS *)(local_11b0 + 0x38);
            local_678 = in_stack_ffffffffffffe298;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16);
            in_stack_ffffffffffffe2a0 =
                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_11b0;
            local_670 = in_stack_ffffffffffffe2a0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16);
            local_560 = local_11e8;
            local_568 = local_bf4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15);
            local_550 = local_1220;
            local_558 = local_c30;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15);
            local_540 = local_1258;
            local_548 = local_de4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15);
            local_530 = local_1290;
            local_538 = local_e20;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)pSVar16,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15);
            computeMinMaxValues(in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8,
                                in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,
                                in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8,
                                &in_stack_ffffffffffffec00->val,in_stack_ffffffffffffec08);
            puVar10 = (ulong *)infinity();
            local_12d0 = *puVar10 ^ 0x8000000000000000;
            local_718 = local_12c8;
            local_720 = &local_12d0;
            local_728 = 0;
            local_450 = local_720;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                       (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                       in_stack_ffffffffffffe2a0);
            tVar5 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffe298,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x420a69);
            local_1b4a = false;
            iVar7 = extraout_EDX_04;
            if (tVar5) {
              local_520 = local_1308;
              local_528 = local_11b0 + 0x38;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
              local_510 = local_1340;
              local_518 = local_b38;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
              feastol(in_stack_ffffffffffffe2d8);
              bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_ffffffffffffe2e0,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffe2d8,in_stack_ffffffffffffe2d0);
              local_1b4a = false;
              iVar7 = extraout_EDX_05;
              if (bVar6) {
                local_708 = infinity();
                local_700 = local_13b0;
                local_710 = 0;
                local_458 = local_708;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                           (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                           in_stack_ffffffffffffe2a0);
                tVar5 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffe298,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x420bbc);
                local_1b4d = false;
                iVar7 = extraout_EDX_06;
                if (tVar5) {
                  local_500 = local_13e8;
                  local_508 = local_11b0;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
                  local_4f0 = local_1420;
                  local_4f8 = local_b70;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
                  feastol(in_stack_ffffffffffffe2d8);
                  local_1b4d = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)in_stack_ffffffffffffe320,
                                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT44(in_stack_ffffffffffffe31c,
                                                      in_stack_ffffffffffffe318),
                                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)in_stack_ffffffffffffe310);
                  iVar7 = extraout_EDX_07;
                }
                local_1b4a = local_1b4d;
              }
            }
            if (local_1b4a != false) {
              pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::index(local_868,(char *)(ulong)local_b80,iVar7);
              local_b78[0] = (int)pcVar11;
              local_b79 = 0;
              break;
            }
          }
        }
      }
    }
    if (-1 < local_b78[0]) {
      local_1460 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::rowVector(in_stack_ffffffffffffe2a0,
                               (int)((ulong)in_stack_ffffffffffffe298 >> 0x20));
      iVar7 = (int)((ulong)in_stack_ffffffffffffe298 >> 0x20);
      if ((local_b79 & 1) == 0) {
        local_1b68 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::rhs(in_stack_ffffffffffffe2a0,iVar7);
      }
      else {
        local_1b68 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::lhs(in_stack_ffffffffffffe2a0,iVar7);
      }
      local_4e0 = &local_1498;
      local_4e8 = local_1b68;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[](in_stack_ffffffffffffe2b8,(int)((ulong)in_stack_ffffffffffffe2b0 >> 0x20));
      SPxOut::
      debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[95],_int_&,_int_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                (in_RDI,(char (*) [95])
                        "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n"
                 ,local_858,local_b78,&local_1498,&local_14d0);
      operator_new(0x160);
      local_1529 = 1;
      local_4d0 = local_1518;
      local_4d8 = &local_1498;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe298);
      pMVar15 = (MultiAggregationPS *)&stack0xffffffffffffead8;
      std::shared_ptr<soplex::Tolerances>::shared_ptr
                ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe2a0,
                 (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe298);
      MultiAggregationPS::MultiAggregationPS
                (in_stack_ffffffffffffe5d0,
                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffe5cf,in_stack_ffffffffffffe5c8),
                 in_stack_ffffffffffffe5c0,(int)((ulong)in_stack_ffffffffffffe5b8 >> 0x20),
                 (int)in_stack_ffffffffffffe5b8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT17(in_stack_ffffffffffffe5b7,
                             CONCAT16(in_stack_ffffffffffffe5b6,
                                      CONCAT15(in_stack_ffffffffffffe5b5,in_stack_ffffffffffffe5b0))
                            ),in_stack_ffffffffffffe700);
      local_1529 = 0;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
      ::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::MultiAggregationPS,void>
                ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                  *)in_stack_ffffffffffffe2a0,pMVar15);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x420f3a);
      Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
      ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                *)in_stack_ffffffffffffe2a0,
               (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                *)pMVar15);
      for (local_1530 = 0; uVar2 = local_1530,
          iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_868), (int)uVar2 < iVar7; local_1530 = local_1530 + 1) {
        pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::index(local_868,(char *)(ulong)local_1530,__c_03);
        if ((int)pcVar11 != local_b78[0]) {
          pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_868,(char *)(ulong)local_1530,__c_04);
          local_1534 = SUB84(pcVar11,0);
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x420fd8);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2ac);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_868,(char *)(ulong)local_1530,__c_05);
          local_4c8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::rhs(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
          local_4c0 = &local_1588;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                     (cpp_dec_float<50U,_int,_void> *)pMVar15);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_868,(char *)(ulong)local_1530,__c_06);
          local_4b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::lhs(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
          local_4b0 = &local_15c0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                     (cpp_dec_float<50U,_int,_void> *)pMVar15);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_868,(char *)(ulong)local_1530,__c_07);
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rowVector(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::operator=(in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
          for (local_15c4 = 0; uVar2 = local_15c4,
              iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(local_1460), (int)uVar2 < iVar7; local_15c4 = local_15c4 + 1) {
            pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::index(local_1460,(char *)(ulong)local_15c4,__c_08);
            if ((int)pcVar11 != local_858[0]) {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rowVector(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::index(local_1460,(char *)(ulong)local_15c4,__c_09);
              iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                            (int)((ulong)in_stack_ffffffffffffe2a0 >> 0x20));
              pMVar4 = local_7f8;
              uVar3 = local_1534;
              if (iVar7 < 0) {
                pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::index(local_1460,(char *)(ulong)local_15c4,__c_10);
                local_1720 = 0xbff0000000000000;
                local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
                local_30 = &local_1720;
                local_28 = &local_1714;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_39,local_38);
                local_20 = &local_1714;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
                local_18 = local_38;
                local_8 = local_30;
                local_10 = &local_1714;
                boost::multiprecision::default_ops::
                eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                           (cpp_dec_float<50U,_int,_void> *)pMVar15,(double *)0x421673);
                local_200 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::value(local_1460,local_15c4);
                local_1f8 = &local_1714;
                local_1f0 = &local_16dc;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_201,local_1f8,local_200);
                local_1e8 = &local_16dc;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
                local_1d8 = local_1f8;
                local_1e0 = local_200;
                local_1d0 = &local_16dc;
                boost::multiprecision::default_ops::
                eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                           (cpp_dec_float<50U,_int,_void> *)pMVar15,
                           (cpp_dec_float<50U,_int,_void> *)0x421742);
                local_338 = &local_16dc;
                local_340 = &local_14d0;
                local_330 = local_16a4;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_341,local_338,local_340);
                local_328 = local_16a4;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
                local_318 = local_338;
                local_320 = local_340;
                local_310 = local_16a4;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                           (cpp_dec_float<50U,_int,_void> *)pMVar15,
                           (cpp_dec_float<50U,_int,_void> *)0x421805);
                (**(code **)(*(long *)(((cpp_dec_float<50U,_int,_void> *)&pMVar4->super_PostStep)->
                                      data)._M_elems + 0x218))
                          (pMVar4,uVar3,(ulong)pcVar11 & 0xffffffff,local_16a4,0);
              }
              else {
                pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::index(local_1460,(char *)(ulong)local_15c4,__c_10);
                SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::index(local_1460,(char *)(ulong)local_15c4,__c_11);
                pnVar12 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
                pnVar13 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
                local_1c0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::value(local_1460,local_15c4);
                local_1b8 = pnVar13;
                local_1b0 = &local_166c;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1c1,pnVar13,local_1c0);
                local_1a8 = &local_166c;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
                local_198 = local_1b8;
                local_1a0 = local_1c0;
                local_190 = &local_166c;
                boost::multiprecision::default_ops::
                eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                           (cpp_dec_float<50U,_int,_void> *)pMVar15,
                           (cpp_dec_float<50U,_int,_void> *)0x421324);
                local_2f8 = &local_166c;
                local_300 = &local_14d0;
                local_2f0 = &local_1634;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_301,local_2f8,local_300);
                local_2e8 = &local_1634;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
                local_2d8 = local_2f8;
                local_2e0 = local_300;
                local_2d0 = &local_1634;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                           (cpp_dec_float<50U,_int,_void> *)pMVar15,
                           (cpp_dec_float<50U,_int,_void> *)0x4213e7);
                local_c0 = &local_1634;
                local_b8 = pnVar12;
                local_b0 = local_15fc;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_c1,pnVar12,local_c0);
                local_a8 = local_15fc;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
                local_98 = local_b8;
                local_a0 = local_c0;
                local_90 = local_15fc;
                boost::multiprecision::default_ops::
                eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                           (cpp_dec_float<50U,_int,_void> *)pMVar15,
                           (cpp_dec_float<50U,_int,_void> *)0x4214aa);
                (**(code **)(*(long *)(((cpp_dec_float<50U,_int,_void> *)&pMVar4->super_PostStep)->
                                      data)._M_elems + 0x218))
                          (pMVar4,uVar3,(ulong)pcVar11 & 0xffffffff,local_15fc);
              }
            }
          }
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rhs(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
          local_6f0 = infinity();
          local_6e8 = local_1758;
          local_6f8 = 0;
          local_460 = local_6f0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                     (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                     in_stack_ffffffffffffe2a0);
          tVar5 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pMVar15,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x4218e1);
          pMVar4 = local_7f8;
          uVar3 = local_1534;
          if (tVar5) {
            local_238 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
            local_240 = &local_1498;
            local_230 = local_1800;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_241,local_238,local_240);
            local_228 = local_1800;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
            local_218 = local_238;
            local_220 = local_240;
            local_210 = local_1800;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15,
                       (cpp_dec_float<50U,_int,_void> *)0x4219e3);
            local_378 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_1800;
            local_380 = &local_14d0;
            local_370 = &local_17c8;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_381,local_378,local_380);
            local_368 = &local_17c8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
            local_358 = local_378;
            local_360 = local_380;
            local_350 = &local_17c8;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15,
                       (cpp_dec_float<50U,_int,_void> *)0x421aa6);
            local_f8 = &local_1588;
            local_100 = &local_17c8;
            local_f0 = local_1790;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_101,local_f8,local_100);
            local_e8 = local_1790;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
            local_d8 = local_f8;
            local_e0 = local_100;
            local_d0 = local_1790;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15,
                       (cpp_dec_float<50U,_int,_void> *)0x421b69);
            (**(code **)(*(long *)(((cpp_dec_float<50U,_int,_void> *)&pMVar4->super_PostStep)->data)
                                  ._M_elems + 0x1b0))(pMVar4,uVar3,local_1790,0);
          }
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::lhs(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
          puVar10 = (ulong *)infinity();
          in_stack_ffffffffffffe7c0 =
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(*puVar10 ^ 0x8000000000000000);
          local_6d0 = &stack0xffffffffffffe7c8;
          local_6d8 = &stack0xffffffffffffe7c0;
          local_6e0 = 0;
          local_468 = local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2b0,
                     (double)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                     in_stack_ffffffffffffe2a0);
          tVar5 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pMVar15,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x421c43);
          pMVar4 = local_7f8;
          uVar3 = local_1534;
          if (tVar5) {
            local_278 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
            local_280 = &local_1498;
            local_270 = &local_18e8;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_281,local_278,local_280);
            local_268 = &local_18e8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
            local_258 = local_278;
            local_260 = local_280;
            local_250 = &local_18e8;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15,
                       (cpp_dec_float<50U,_int,_void> *)0x421d45);
            local_3b8 = &local_18e8;
            local_3c0 = &local_14d0;
            local_3b0 = &local_18b0;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_3c1,local_3b8,local_3c0);
            local_3a8 = &local_18b0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
            local_398 = local_3b8;
            local_3a0 = local_3c0;
            local_390 = &local_18b0;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15,
                       (cpp_dec_float<50U,_int,_void> *)0x421e08);
            local_138 = &local_15c0;
            local_140 = &local_18b0;
            local_130 = local_1878;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_141,local_138,local_140);
            local_128 = local_1878;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
            local_118 = local_138;
            local_120 = local_140;
            local_110 = local_1878;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                       (cpp_dec_float<50U,_int,_void> *)pMVar15,
                       (cpp_dec_float<50U,_int,_void> *)0x421ecb);
            (**(code **)(*(long *)(((cpp_dec_float<50U,_int,_void> *)&pMVar4->super_PostStep)->data)
                                  ._M_elems + 0x198))(pMVar4,uVar3,local_1878,0);
          }
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x421f05);
        }
      }
      for (local_18ec = 0;
          iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_1460), (int)local_18ec < iVar7; local_18ec = local_18ec + 1) {
        pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::index(local_1460,(char *)(ulong)local_18ec,__c_12);
        if ((int)pcVar11 != local_858[0]) {
          in_stack_ffffffffffffe310 = local_7f8;
          pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_1460,(char *)(ulong)local_18ec,__c_13);
          in_stack_ffffffffffffe31c = SUB84(pcVar11,0);
          in_stack_ffffffffffffe320 = local_7f8;
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_1460,(char *)(ulong)local_18ec,__c_14);
          pnVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::maxObj(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
          pnVar13 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::maxObj(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
          local_2c0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::value(local_1460,local_18ec);
          local_2b8 = pnVar13;
          local_2b0 = &local_1994;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_2c1,pnVar13,local_2c0);
          local_2a8 = &local_1994;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
          local_298 = local_2b8;
          local_2a0 = local_2c0;
          local_290 = &local_1994;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                     (cpp_dec_float<50U,_int,_void> *)pMVar15,
                     (cpp_dec_float<50U,_int,_void> *)0x4220bf);
          local_3f8 = &local_1994;
          local_400 = &local_14d0;
          local_3f0 = &local_195c;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_401,local_3f8,local_400);
          local_3e8 = &local_195c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
          local_3d8 = local_3f8;
          local_3e0 = local_400;
          local_3d0 = &local_195c;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                     (cpp_dec_float<50U,_int,_void> *)pMVar15,
                     (cpp_dec_float<50U,_int,_void> *)0x422179);
          local_180 = &local_195c;
          local_178 = pnVar12;
          local_170 = local_1924;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_181,pnVar12,local_180);
          local_168 = local_1924;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0);
          local_158 = local_178;
          local_160 = local_180;
          local_150 = local_1924;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe2a0,
                     (cpp_dec_float<50U,_int,_void> *)pMVar15,
                     (cpp_dec_float<50U,_int,_void> *)0x422233);
          (**(code **)(*(long *)(((cpp_dec_float<50U,_int,_void> *)
                                 &in_stack_ffffffffffffe310->super_PostStep)->data)._M_elems + 0x138
                      ))(in_stack_ffffffffffffe310,in_stack_ffffffffffffe31c,local_1924,0);
        }
      }
      local_808 = local_808 + 1;
      pSVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::colVector(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
      iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(pSVar9);
      local_80c = local_80c + iVar7;
      removeCol(in_stack_ffffffffffffe2b0,
                (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                (int)((ulong)in_stack_ffffffffffffe2a0 >> 0x20));
      local_804 = local_804 + 1;
      pSVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::rowVector(in_stack_ffffffffffffe2a0,(int)((ulong)pMVar15 >> 0x20));
      iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(pSVar9);
      local_80c = local_80c + iVar7;
      removeRow(in_stack_ffffffffffffe2b0,
                (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8),
                (int)((ulong)in_stack_ffffffffffffe2a0 >> 0x20));
      piVar14 = DataArray<int>::operator[](&in_RDI->m_stat,0x10);
      *piVar14 = *piVar14 + 1;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
      ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                     *)0x42236c);
      in_stack_ffffffffffffe298 = pMVar15;
    }
  } while( true );
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::multiaggregation(SPxLPBase<R>& lp, bool& again)
{
   // this simplifier eliminates rows and columns by performing multi aggregations as identified by the constraint
   // activities.
   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   VectorBase<R> upLocks(lp.nCols());
   VectorBase<R> downLocks(lp.nCols());

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      // setting the locks on the variables
      upLocks[j] = 0;
      downLocks[j] = 0;

      if(lp.colVector(j).size() <= 1)
         continue;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(lp.lhs(col.index(k)) > R(-infinity) && lp.rhs(col.index(k)) < R(infinity))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(lp.lhs(col.index(k)) > R(-infinity))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(lp.rhs(col.index(k)) < R(infinity))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      // multi-aggregate column
      if(upLocks[j] == 1 || downLocks[j] == 1)
      {
         R lower = lp.lower(j);
         R upper = lp.upper(j);
         int maxOtherLocks;
         int bestpos = -1;
         bool bestislhs = true;

         for(int k = 0; k < col.size(); ++k)
         {
            int rowNumber;
            R lhs;
            R rhs;
            bool lhsExists;
            bool rhsExists;
            bool aggLhs;
            bool aggRhs;

            R val = col.value(k);

            rowNumber = col.index(k);
            lhs = lp.lhs(rowNumber);
            rhs = lp.rhs(rowNumber);

            if(EQ(lhs, rhs, feastol()))
               continue;

            lhsExists = lhs > R(-infinity);
            rhsExists = rhs < R(infinity);

            if(lp.rowVector(rowNumber).size() <= 2)
               maxOtherLocks = INT_MAX;
            else if(lp.rowVector(rowNumber).size() == 3)
               maxOtherLocks = 3;
            else if(lp.rowVector(rowNumber).size() == 4)
               maxOtherLocks = 2;
            else
               maxOtherLocks = 1;

            aggLhs = lhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks));
            aggRhs = rhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks));

            if(aggLhs || aggRhs)
            {
               R minRes = 0;   // this is the minimum value that the aggregation can attain
               R maxRes = 0;   // this is the maximum value that the aggregation can attain

               // computing the minimum and maximum residuals if variable j is set to zero.
               computeMinMaxResidualActivity(lp, rowNumber, j, minRes, maxRes);

               // we will try to aggregate to the lhs
               if(aggLhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, lhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  // if the bounds of the aggregation and the original variable are equivalent, then we can reduce
                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = true;
                     break;
                  }
               }

               // we will try to aggregate to the rhs
               if(aggRhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, rhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = false;
                     break;
                  }
               }
            }
         }

         // it is only possible to aggregate if a best position has been found
         if(bestpos >= 0)
         {
            const SVectorBase<R>& bestRow = lp.rowVector(bestpos);
            // aggregating the variable and applying the fixings to the all other constraints
            R aggConstant = (bestislhs ? lp.lhs(bestpos) : lp.rhs(
                                bestpos));   // this is the lhs or rhs of the aggregated row
            R aggAij =
               bestRow[j];                                   // this is the coefficient of the deleted col

            SPxOut::debug(this,
                          "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n",
                          j, bestpos, aggConstant, aggAij);

            std::shared_ptr<PostStep> ptr(new MultiAggregationPS(lp, *this, bestpos, j,
                                          aggConstant, this->_tolerances));
            m_hist.append(ptr);

            for(int k = 0; k < col.size(); ++k)
            {
               if(col.index(k) != bestpos)
               {
                  int rowNumber = col.index(k);
                  VectorBase<R> updateRow(lp.nCols());
                  R updateRhs = lp.rhs(col.index(k));
                  R updateLhs = lp.lhs(col.index(k));

                  updateRow = lp.rowVector(col.index(k));

                  // updating the row with the best row
                  for(int l = 0; l < bestRow.size(); l++)
                  {
                     if(bestRow.index(l) != j)
                     {
                        if(lp.rowVector(rowNumber).pos(bestRow.index(l)) >= 0)
                           lp.changeElement(rowNumber, bestRow.index(l), updateRow[bestRow.index(l)]
                                            - updateRow[j]*bestRow.value(l) / aggAij);
                        else
                           lp.changeElement(rowNumber, bestRow.index(l), -1.0 * updateRow[j]*bestRow.value(l) / aggAij);
                     }
                  }

                  // NOTE: I don't know whether we should change the LHS and RHS if they are currently at R(infinity)
                  if(lp.rhs(rowNumber) < R(infinity))
                     lp.changeRhs(rowNumber, updateRhs - updateRow[j]*aggConstant / aggAij);

                  if(lp.lhs(rowNumber) > R(-infinity))
                     lp.changeLhs(rowNumber, updateLhs - updateRow[j]*aggConstant / aggAij);

                  assert(LE(lp.lhs(rowNumber), lp.rhs(rowNumber), this->tolerances()->epsilon()));
               }
            }

            for(int l = 0; l < bestRow.size(); l++)
            {
               if(bestRow.index(l) != j)
                  lp.changeMaxObj(bestRow.index(l),
                                  lp.maxObj(bestRow.index(l)) - lp.maxObj(j)*bestRow.value(l) / aggAij);
            }

            ++remCols;
            remNzos += lp.colVector(j).size();
            removeCol(lp, j);
            ++remRows;
            remNzos += lp.rowVector(bestpos).size();
            removeRow(lp, bestpos);

            ++m_stat[MULTI_AGG];
         }
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (multi-aggregation) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}